

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

PropertyId * __thiscall Js::JavascriptRegExp::GetSpecialPropertyIdsInlined(JavascriptRegExp *this)

{
  ThreadConfiguration *pTVar1;
  PropertyId *pPVar2;
  PropertyId *pPVar3;
  bool bVar4;
  
  pTVar1 = (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig;
  bVar4 = pTVar1->m_ES2018RegExDotAll != false;
  pPVar3 = specialPropertyIdsWithoutDotAll;
  if (bVar4) {
    pPVar3 = specialPropertyIdsAll;
  }
  pPVar2 = specialPropertyIdsWithoutDotAllOrUnicode;
  if (bVar4) {
    pPVar2 = specialPropertyIdsWithoutUnicode;
  }
  if (pTVar1->m_ES6Unicode != false) {
    pPVar2 = pPVar3;
  }
  return pPVar2;
}

Assistant:

inline PropertyId const * JavascriptRegExp::GetSpecialPropertyIdsInlined() const
    {
        const ScriptConfiguration* config = GetScriptContext()->GetConfig();
        if (config->IsES6UnicodeExtensionsEnabled())
        {
            if (config->IsES2018RegExDotAllEnabled())
            {
                return specialPropertyIdsAll;
            }
            else
            {
                return specialPropertyIdsWithoutDotAll;
            }
        }
        else
        {
            if (config->IsES2018RegExDotAllEnabled())
            {
                return specialPropertyIdsWithoutUnicode;
            }
            else
            {
                return specialPropertyIdsWithoutDotAllOrUnicode;
            }
        }
    }